

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.h
# Opt level: O0

void __thiscall HighsOptionsStruct::HighsOptionsStruct(HighsOptionsStruct *this)

{
  undefined8 *in_RDI;
  HighsLogOptions *this_00;
  allocator local_26;
  allocator local_25;
  allocator local_24;
  allocator local_23;
  allocator local_22;
  allocator local_21;
  allocator local_20;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [20];
  allocator local_9 [9];
  
  *in_RDI = &PTR__HighsOptionsStruct_0096d780;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 1),"",local_9);
  std::allocator<char>::~allocator((allocator<char> *)local_9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 5),"",local_1d);
  std::allocator<char>::~allocator((allocator<char> *)local_1d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 9),"",&local_1e);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0xd),"",&local_1f);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f);
  in_RDI[0x11] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x12),"",&local_20);
  std::allocator<char>::~allocator((allocator<char> *)&local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x16),"",&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  *(undefined4 *)(in_RDI + 0x1a) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x1b),"",&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  in_RDI[0x1f] = 0;
  in_RDI[0x20] = 0;
  in_RDI[0x21] = 0;
  in_RDI[0x22] = 0;
  in_RDI[0x23] = 0;
  in_RDI[0x24] = 0;
  in_RDI[0x25] = 0;
  in_RDI[0x26] = 0;
  in_RDI[0x27] = 0;
  in_RDI[0x28] = 0;
  in_RDI[0x29] = 0;
  *(undefined4 *)(in_RDI + 0x2a) = 0;
  *(undefined4 *)((long)in_RDI + 0x154) = 0;
  *(undefined4 *)(in_RDI + 0x2b) = 0;
  *(undefined4 *)((long)in_RDI + 0x15c) = 0;
  *(undefined4 *)(in_RDI + 0x2c) = 0;
  *(undefined4 *)((long)in_RDI + 0x164) = 0;
  *(undefined4 *)(in_RDI + 0x2d) = 0;
  *(undefined4 *)((long)in_RDI + 0x16c) = 0;
  *(undefined4 *)(in_RDI + 0x2e) = 0;
  *(undefined4 *)((long)in_RDI + 0x174) = 0;
  *(undefined4 *)(in_RDI + 0x2f) = 0;
  *(undefined4 *)((long)in_RDI + 0x17c) = 0;
  *(undefined4 *)(in_RDI + 0x30) = 0;
  *(undefined4 *)((long)in_RDI + 0x184) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x31),"",&local_23);
  std::allocator<char>::~allocator((allocator<char> *)&local_23);
  *(undefined1 *)(in_RDI + 0x35) = 0;
  *(undefined1 *)((long)in_RDI + 0x1a9) = 0;
  *(undefined1 *)((long)in_RDI + 0x1aa) = 0;
  *(undefined4 *)((long)in_RDI + 0x1ac) = 0;
  *(undefined4 *)(in_RDI + 0x36) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x37),"",&local_24);
  std::allocator<char>::~allocator((allocator<char> *)&local_24);
  *(undefined1 *)(in_RDI + 0x3b) = 0;
  *(undefined1 *)((long)in_RDI + 0x1d9) = 0;
  *(undefined1 *)((long)in_RDI + 0x1da) = 0;
  *(undefined4 *)((long)in_RDI + 0x1dc) = 0;
  *(undefined1 *)(in_RDI + 0x3c) = 0;
  *(undefined1 *)((long)in_RDI + 0x1e1) = 0;
  *(undefined4 *)((long)in_RDI + 0x1e4) = 0;
  *(undefined4 *)(in_RDI + 0x3d) = 0;
  in_RDI[0x3e] = 0;
  *(undefined4 *)(in_RDI + 0x3f) = 0;
  *(undefined4 *)((long)in_RDI + 0x1fc) = 0;
  *(undefined4 *)(in_RDI + 0x40) = 0;
  *(undefined1 *)((long)in_RDI + 0x204) = 0;
  *(undefined4 *)(in_RDI + 0x41) = 0;
  *(undefined1 *)((long)in_RDI + 0x20c) = 0;
  *(undefined1 *)((long)in_RDI + 0x20d) = 0;
  *(undefined1 *)((long)in_RDI + 0x20e) = 0;
  *(undefined1 *)((long)in_RDI + 0x20f) = 0;
  *(undefined1 *)(in_RDI + 0x42) = 0;
  *(undefined1 *)((long)in_RDI + 0x211) = 0;
  *(undefined1 *)((long)in_RDI + 0x212) = 1;
  *(undefined4 *)((long)in_RDI + 0x214) = 0;
  *(undefined4 *)(in_RDI + 0x43) = 0;
  *(undefined4 *)((long)in_RDI + 0x21c) = 0;
  *(undefined4 *)(in_RDI + 0x44) = 0;
  *(undefined4 *)((long)in_RDI + 0x224) = 0;
  *(undefined4 *)(in_RDI + 0x45) = 0;
  *(undefined4 *)((long)in_RDI + 0x22c) = 0;
  *(undefined4 *)(in_RDI + 0x46) = 0;
  *(undefined4 *)((long)in_RDI + 0x234) = 0;
  *(undefined4 *)(in_RDI + 0x47) = 0;
  *(undefined4 *)((long)in_RDI + 0x23c) = 0;
  *(undefined4 *)(in_RDI + 0x48) = 0;
  *(undefined4 *)((long)in_RDI + 0x244) = 0;
  *(undefined4 *)(in_RDI + 0x49) = 0;
  *(undefined4 *)((long)in_RDI + 0x24c) = 0;
  *(undefined1 *)(in_RDI + 0x4a) = 0;
  *(undefined1 *)((long)in_RDI + 0x251) = 0;
  *(undefined1 *)((long)in_RDI + 0x252) = 0;
  *(undefined1 *)((long)in_RDI + 0x253) = 0;
  in_RDI[0x4b] = 0;
  in_RDI[0x4c] = 0;
  in_RDI[0x4d] = 0;
  in_RDI[0x4e] = 0;
  in_RDI[0x4f] = 0;
  in_RDI[0x50] = 0;
  in_RDI[0x51] = 0;
  in_RDI[0x52] = 0;
  in_RDI[0x53] = 0;
  in_RDI[0x54] = 0;
  in_RDI[0x55] = 0;
  *(undefined1 *)(in_RDI + 0x56) = 0;
  *(undefined1 *)((long)in_RDI + 0x2b1) = 0;
  *(undefined1 *)((long)in_RDI + 0x2b2) = 0;
  *(undefined1 *)((long)in_RDI + 0x2b3) = 0;
  *(undefined4 *)((long)in_RDI + 0x2b4) = 0;
  in_RDI[0x57] = 0;
  *(undefined1 *)(in_RDI + 0x58) = 0;
  *(undefined1 *)((long)in_RDI + 0x2c1) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x59),"",&local_25);
  std::allocator<char>::~allocator((allocator<char> *)&local_25);
  in_RDI[0x5d] = 0;
  *(undefined4 *)(in_RDI + 0x5e) = 0;
  *(undefined4 *)((long)in_RDI + 0x2f4) = 0;
  *(undefined1 *)(in_RDI + 0x5f) = 0;
  *(undefined1 *)((long)in_RDI + 0x2f9) = 0;
  *(undefined1 *)((long)in_RDI + 0x2fa) = 0;
  *(undefined1 *)((long)in_RDI + 0x2fb) = 0;
  *(undefined4 *)((long)in_RDI + 0x2fc) = 0;
  *(undefined4 *)(in_RDI + 0x60) = 0;
  *(undefined4 *)((long)in_RDI + 0x304) = 0;
  *(undefined4 *)(in_RDI + 0x61) = 0;
  *(undefined4 *)((long)in_RDI + 0x30c) = 0;
  *(undefined4 *)(in_RDI + 0x62) = 0;
  *(undefined4 *)((long)in_RDI + 0x314) = 0;
  *(undefined4 *)(in_RDI + 99) = 0;
  *(undefined4 *)((long)in_RDI + 0x31c) = 0;
  *(undefined4 *)(in_RDI + 100) = 0;
  *(undefined4 *)((long)in_RDI + 0x324) = 0;
  in_RDI[0x65] = 0;
  in_RDI[0x66] = 0;
  in_RDI[0x67] = 0;
  in_RDI[0x68] = 0;
  in_RDI[0x69] = 0;
  *(undefined1 *)(in_RDI + 0x6a) = 0;
  *(undefined1 *)((long)in_RDI + 0x351) = 0;
  this_00 = (HighsLogOptions *)(in_RDI + 0x6b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this_00,"",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  *(undefined1 *)(in_RDI + 0x6f) = 0;
  *(undefined4 *)((long)in_RDI + 0x37c) = 0xffffffff;
  HighsLogOptions::HighsLogOptions(this_00);
  return;
}

Assistant:

HighsOptionsStruct()
      : presolve(""),
        solver(""),
        parallel(""),
        run_crossover(""),
        time_limit(0.0),
        solution_file(""),
        write_model_file(""),
        random_seed(0),
        ranging(""),
        infinite_cost(0.0),
        infinite_bound(0.0),
        small_matrix_value(0.0),
        large_matrix_value(0.0),
        primal_feasibility_tolerance(0.0),
        dual_feasibility_tolerance(0.0),
        ipm_optimality_tolerance(0.0),
        primal_residual_tolerance(0.0),
        dual_residual_tolerance(0.0),
        objective_bound(0.0),
        objective_target(0.0),
        threads(0),
        user_bound_scale(0),
        user_cost_scale(0),
        highs_debug_level(0),
        highs_analysis_level(0),
        simplex_strategy(0),
        simplex_scale_strategy(0),
        simplex_crash_strategy(0),
        simplex_dual_edge_weight_strategy(0),
        simplex_primal_edge_weight_strategy(0),
        simplex_iteration_limit(0),
        simplex_update_limit(0),
        simplex_min_concurrency(0),
        simplex_max_concurrency(0),
        log_file(""),
        write_model_to_file(false),
        write_presolved_model_to_file(false),
        write_solution_to_file(false),
        write_solution_style(0),
        glpsol_cost_row_location(0),
        write_presolved_model_file(""),
        output_flag(false),
        log_to_console(false),
        timeless_log(false),
        ipm_iteration_limit(0),
        pdlp_native_termination(false),
        pdlp_scaling(false),
        pdlp_iteration_limit(0),
        pdlp_e_restart_method(0),
        pdlp_d_gap_tol(0.0),
        qp_iteration_limit(0),
        qp_nullspace_limit(0),
        iis_strategy(0),
        blend_multi_objectives(false),
        log_dev_level(0),
        log_githash(false),
        solve_relaxation(false),
        allow_unbounded_or_infeasible(false),
        use_implied_bounds_from_presolve(false),
        lp_presolve_requires_basis_postsolve(false),
        mps_parser_type_free(false),
        use_warm_start(true),
        keep_n_rows(0),
        cost_scale_factor(0),
        allowed_matrix_scale_factor(0),
        allowed_cost_scale_factor(0),
        ipx_dualize_strategy(0),
        simplex_dualize_strategy(0),
        simplex_permute_strategy(0),
        max_dual_simplex_cleanup_level(0),
        max_dual_simplex_phase1_cleanup_level(0),
        simplex_price_strategy(0),
        simplex_unscaled_solution_strategy(0),
        presolve_reduction_limit(0),
        restart_presolve_reduction_limit(0),
        presolve_substitution_maxfillin(0),
        presolve_rule_off(0),
        presolve_rule_logging(false),
        presolve_remove_slacks(false),
        simplex_initial_condition_check(false),
        no_unnecessary_rebuild_refactor(false),
        simplex_initial_condition_tolerance(0.0),
        rebuild_refactor_solution_error_tolerance(0.0),
        dual_steepest_edge_weight_error_tolerance(0.0),
        dual_steepest_edge_weight_log_error_threshold(0.0),
        dual_simplex_cost_perturbation_multiplier(0.0),
        primal_simplex_bound_perturbation_multiplier(0.0),
        dual_simplex_pivot_growth_tolerance(0.0),
        presolve_pivot_threshold(0.0),
        factor_pivot_threshold(0.0),
        factor_pivot_tolerance(0.0),
        start_crossover_tolerance(0.0),
        less_infeasible_DSE_check(false),
        less_infeasible_DSE_choose_row(false),
        use_original_HFactor_logic(false),
        run_centring(false),
        max_centring_steps(0),
        centring_ratio_tolerance(0.0),
        icrash(false),
        icrash_dualize(false),
        icrash_strategy(""),
        icrash_starting_weight(0.0),
        icrash_iterations(0),
        icrash_approx_iter(0),
        icrash_exact(false),
        icrash_breakpoints(false),
        mip_detect_symmetry(false),
        mip_allow_restart(false),
        mip_max_nodes(0),
        mip_max_stall_nodes(0),
        mip_max_start_nodes(0),
        mip_max_leaves(0),
        mip_max_improving_sols(0),
        mip_lp_age_limit(0),
        mip_pool_age_limit(0),
        mip_pool_soft_limit(0),
        mip_pscost_minreliable(0),
        mip_min_cliquetable_entries_for_parallelism(0),
        mip_report_level(0),
        mip_feasibility_tolerance(0.0),
        mip_rel_gap(0.0),
        mip_abs_gap(0.0),
        mip_heuristic_effort(0.0),
        mip_min_logging_interval(0.0),
#ifdef HIGHS_DEBUGSOL
        mip_debug_solution_file(""),
#endif
        mip_improving_solution_save(false),
        mip_improving_solution_report_sparse(false),
        // clang-format off
        mip_improving_solution_file(""),
        mip_root_presolve_only(false),
        mip_lifting_for_probing(-1) {}